

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O2

void * TPZStructMatrixOR<std::complex<double>_>::ThreadData::ThreadWork(void *datavoid)

{
  TPZCompMesh *mesh;
  long lVar1;
  TPZCompEl *pTVar2;
  bool bVar3;
  int iVar4;
  int64_t nelem;
  TPZElementMatrixT<std::complex<double>_> *pTVar5;
  TPZCompEl **ppTVar6;
  long lVar7;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> ek;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> ef;
  TPZAutoPointer<TPZGuiInterface> guiInterface;
  
  nelem = NextElement((ThreadData *)datavoid);
  mesh = *(TPZCompMesh **)(*datavoid + 8);
  guiInterface.fRef = *(TPZReference **)((long)datavoid + 8);
  LOCK();
  ((guiInterface.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((guiInterface.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  lVar1 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  do {
    if (lVar1 <= nelem) break;
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::TPZAutoPointer(&ek);
    pTVar5 = (TPZElementMatrixT<std::complex<double>_> *)operator_new(0x81d0);
    TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(pTVar5,mesh,EF);
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::TPZAutoPointer(&ef,pTVar5);
    if (*(long *)((long)datavoid + 0x10) == 0) {
      TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator=(&ek,&ef);
    }
    else {
      pTVar5 = (TPZElementMatrixT<std::complex<double>_> *)operator_new(0x81d0);
      TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(pTVar5,mesh,EK);
      TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator=(&ek,pTVar5);
    }
    ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    pTVar2 = *ppTVar6;
    if (*(long *)((long)datavoid + 0x10) == 0) {
      (**(code **)(*(long *)pTVar2 + 0x128))(pTVar2,(ef.fRef)->fPointer);
    }
    else {
      (**(code **)(*(long *)pTVar2 + 0x110))(pTVar2,(ek.fRef)->fPointer,(ef.fRef)->fPointer);
    }
    if (((guiInterface.fRef == (TPZReference *)0x0) ||
        ((guiInterface.fRef)->fPointer == (TPZGuiInterface *)0x0)) ||
       (bVar3 = TPZGuiInterface::AmIKilled((guiInterface.fRef)->fPointer), !bVar3)) {
      iVar4 = (**(code **)(*(long *)pTVar2 + 0x1f0))(pTVar2);
      if (iVar4 == 0) {
        TPZElementMatrix::ComputeDestinationIndices(&(ek.fRef)->fPointer->super_TPZElementMatrix);
        lVar7 = *datavoid;
        if (*(char *)(lVar7 + 0x58) != '\0') goto LAB_011a400b;
      }
      else {
        if (*(long *)((long)datavoid + 0x10) != 0) {
          (*((ek.fRef)->fPointer->super_TPZElementMatrix)._vptr_TPZElementMatrix[6])();
        }
        (*((ef.fRef)->fPointer->super_TPZElementMatrix)._vptr_TPZElementMatrix[6])();
        TPZElementMatrix::ComputeDestinationIndices(&(ek.fRef)->fPointer->super_TPZElementMatrix);
        lVar7 = *datavoid;
        if (*(char *)(lVar7 + 0x58) == '\x01') {
LAB_011a400b:
          TPZEquationFilter::Filter
                    ((TPZEquationFilter *)(lVar7 + 0x48),
                     &((ek.fRef)->fPointer->super_TPZElementMatrix).fSourceIndex.super_TPZVec<long>,
                     &((ek.fRef)->fPointer->super_TPZElementMatrix).fDestinationIndex.
                      super_TPZVec<long>);
        }
      }
      ComputedElementMatrix((ThreadData *)datavoid,nelem,&ek,&ef);
      nelem = NextElement((ThreadData *)datavoid);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer(&ef);
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer(&ek);
  } while (bVar3);
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)datavoid + 0x88))->__data);
  TPZSemaphore::Post((TPZSemaphore *)((long)datavoid + 0xb0));
  pthread_mutex_unlock((pthread_mutex_t *)((long)datavoid + 0x88));
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&guiInterface);
  return (void *)0x0;
}

Assistant:

void *
TPZStructMatrixOR<TVar>::ThreadData::ThreadWork(void *datavoid) {
#ifdef PZDEBUG
    TExceptionManager activateExceptions;
#endif
    ThreadData *data = (ThreadData *) datavoid;
    const bool computeRhs = data->fComputeRhs;
    // compute the next element (this method is threadsafe)
    int64_t iel = data->NextElement();

    TPZCompMesh *cmesh = data->fStruct->Mesh();
    TPZAutoPointer<TPZGuiInterface> guiInterface = data->fGuiInterface;
    int64_t nel = cmesh->NElements();
    while (iel < nel) {

        TPZAutoPointer<TPZElementMatrixT<TVar>> ek;
        TPZAutoPointer<TPZElementMatrixT<TVar>> ef =
            new TPZElementMatrixT<TVar>(cmesh, TPZElementMatrix::EF);
        if (data->fGlobMatrix) {
            ek = new TPZElementMatrixT<TVar>(cmesh, TPZElementMatrix::EK);
        } else {
            ek = ef;
        }

        TPZCompEl *el = cmesh->ElementVec()[iel];

#ifndef DRY_RUN
        if (data->fGlobMatrix) {
            el->CalcStiff(ek, ef);
        } else {
            el->CalcResidual(ef);
        }
#else
        {
            TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (el);
            if (!intel) {
                DebugStop();
            }
            if (data->fGlobMatrix) {
                intel->InitializeElementMatrix(ekr, efr);
            } else {
                intel->InitializeElementMatrix(efr);
            }
        }
#endif

        if (guiInterface) if (guiInterface->AmIKilled()) {
                break;
            }

        if (!el->HasDependency()) {
            ek->ComputeDestinationIndices();

            if (data->fStruct->HasRange()) {
                data->fStruct->FilterEquations(ek->fSourceIndex, ek->fDestinationIndex);
            }
#ifdef PZ_LOG
            if (loggerel.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Element index " << iel << std::endl;
                ek->fMat.Print("Element stiffness matrix", sout);
                if(computeRhs) ef->fMat.Print("Element right hand side", sout);
                LOGPZ_DEBUG(loggerel, sout.str())
            }
#endif
        } else {
            // the element has dependent nodes
            if (data->fGlobMatrix) {
                ek->ApplyConstraints();
            }
            ef->ApplyConstraints();
            ek->ComputeDestinationIndices();
            if (data->fStruct->HasRange()) {
                data->fStruct->FilterEquations(ek->fSourceIndex, ek->fDestinationIndex);
            }
#ifdef PZ_LOG
            if (loggerel2.isDebugEnabled() && el->Reference() && el->Reference()->MaterialId() == 1 && el->IsInterface()) {
                std::stringstream sout;
                el->Reference()->Print(sout);
                el->Print(sout);
                ek->Print(sout);
                //			ef->Print(sout);
                LOGPZ_DEBUG(loggerel2, sout.str())
            }
#endif
#ifdef PZ_LOG
            if (loggerel.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Element index " << iel << std::endl;
                ek->fConstrMat.Print("Element stiffness matrix", sout);
                if(computeRhs) ef->fConstrMat.Print("Element right hand side", sout);
                LOGPZ_DEBUG(loggerel, sout.str())
            }
#endif
        }


        // put the elementmatrices on the stack to be assembled (threadsafe)
        data->ComputedElementMatrix(iel, ek, ef);
        // compute the next element (this method is threadsafe)
        iel = data->NextElement();
    }

    {
      std::scoped_lock lock(data->fMutexAccessElement);
      data->fAssembly.Post();
    }

    return 0;
}